

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg.c
# Opt level: O0

void aom_int_pro_col_c(int16_t *vbuf,uint8_t *ref,int ref_stride,int width,int height,
                      int norm_factor)

{
  int idx;
  int16_t sum;
  int ht;
  int norm_factor_local;
  int height_local;
  int width_local;
  int ref_stride_local;
  uint8_t *ref_local;
  int16_t *vbuf_local;
  
  ref_local = ref;
  for (ht = 0; ht < height; ht = ht + 1) {
    sum = 0;
    for (idx = 0; idx < width; idx = idx + 1) {
      sum = sum + (ushort)ref_local[idx];
    }
    vbuf[ht] = (int16_t)((int)sum >> ((byte)norm_factor & 0x1f));
    ref_local = ref_local + ref_stride;
  }
  return;
}

Assistant:

void aom_int_pro_col_c(int16_t *vbuf, const uint8_t *ref, const int ref_stride,
                       const int width, const int height, int norm_factor) {
  for (int ht = 0; ht < height; ++ht) {
    int16_t sum = 0;
    // sum: 14 bit, dynamic range [0, 32640]
    for (int idx = 0; idx < width; ++idx) sum += ref[idx];
    vbuf[ht] = sum >> norm_factor;
    ref += ref_stride;
  }
}